

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O1

int secp256k1_modinv32_mul_cmp_30
              (secp256k1_modinv32_signed30 *a,int alen,secp256k1_modinv32_signed30 *b,int32_t factor
              )

{
  secp256k1_scalar *a_00;
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  int extraout_EAX_03;
  uint32_t uVar9;
  int extraout_EAX_04;
  long lVar10;
  ulong uVar11;
  secp256k1_modinv32_signed30 *psVar12;
  ulong extraout_RAX;
  int iVar13;
  secp256k1_modinv32_signed30 *b_00;
  int extraout_EDX;
  uint uVar14;
  uint uVar15;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int *extraout_RDX;
  uint *extraout_RDX_00;
  int32_t *piVar16;
  long lVar17;
  secp256k1_modinv32_signed30 *b_01;
  ulong uVar18;
  long *extraout_RDX_01;
  int *piVar19;
  secp256k1_fe *psVar20;
  int iVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  secp256k1_fe *psVar25;
  ulong uVar26;
  secp256k1_fe *psVar27;
  secp256k1_fe *r;
  secp256k1_modinv32_signed30 *a_01;
  long lVar28;
  secp256k1_modinv32_signed30 *psVar29;
  ulong uVar30;
  secp256k1_fe *r_00;
  uchar *__s;
  uint uVar31;
  uint uVar32;
  ulong uVar33;
  uint uVar34;
  int *piVar35;
  long lVar36;
  long lVar37;
  uint uVar38;
  secp256k1_modinv32_signed30 *psVar39;
  code *pcVar40;
  uint uVar41;
  secp256k1_modinv32_signed30 *psVar42;
  size_t count;
  uint uVar43;
  code *pcVar44;
  bool bVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  secp256k1_modinv32_signed30 bm;
  secp256k1_modinv32_signed30 am;
  ulong uStack_1350;
  secp256k1_fe *psStack_1348;
  uchar auStack_1340 [4232];
  secp256k1_fe *psStack_2b8;
  code *pcStack_2b0;
  undefined8 uStack_2a8;
  secp256k1_fe *psStack_2a0;
  code *pcStack_298;
  code *pcStack_290;
  undefined1 auStack_288 [36];
  int iStack_264;
  int iStack_260;
  int iStack_25c;
  int iStack_258;
  int iStack_254;
  int iStack_250;
  int iStack_24c;
  undefined1 auStack_248 [48];
  code *pcStack_218;
  secp256k1_fe sStack_210;
  secp256k1_fe sStack_1e0;
  secp256k1_fe sStack_1b0;
  ulong uStack_178;
  ulong uStack_170;
  ulong uStack_168;
  secp256k1_modinv32_signed30 *psStack_160;
  ulong uStack_158;
  code *pcStack_150;
  uint uStack_148;
  uint uStack_144;
  uint uStack_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  secp256k1_modinv32_signed30 *psStack_130;
  uint uStack_124;
  uint uStack_120;
  uint uStack_11c;
  uint uStack_118;
  int32_t iStack_114;
  secp256k1_modinv32_signed30 *psStack_110;
  secp256k1_modinv32_signed30 *psStack_108;
  secp256k1_modinv32_signed30 *psStack_100;
  secp256k1_modinv32_signed30 *psStack_f8;
  secp256k1_modinv32_signed30 *psStack_f0;
  code *pcStack_e8;
  long lStack_d8;
  long lStack_d0;
  int *piStack_c8;
  secp256k1_modinv32_signed30 local_58;
  secp256k1_modinv32_signed30 local_34;
  
  psVar29 = &local_58;
  piVar19 = (int *)(ulong)(uint)factor;
  secp256k1_modinv32_mul_30(&local_34,a,alen,1);
  piVar35 = piVar19;
  secp256k1_modinv32_mul_30(&local_58,b,9,factor);
  lVar10 = 0;
  while ((uint)local_34.v[lVar10] < 0x40000000) {
    if (0x3fffffff < (uint)local_58.v[lVar10]) goto LAB_00155933;
    lVar10 = lVar10 + 1;
    if (lVar10 == 8) {
      uVar5 = 8;
      while( true ) {
        if (local_34.v[uVar5] < local_58.v[uVar5]) {
          return -1;
        }
        if (local_58.v[uVar5] < local_34.v[uVar5]) break;
        bVar45 = uVar5 == 0;
        uVar5 = uVar5 - 1;
        if (bVar45) {
          return 0;
        }
      }
      return 1;
    }
  }
  secp256k1_modinv32_mul_cmp_30_cold_2();
LAB_00155933:
  secp256k1_modinv32_mul_cmp_30_cold_1();
  iVar6 = (int)psVar29;
  if (iVar6 < 1) {
    secp256k1_modinv32_update_fg_30_var_cold_3();
LAB_00155a26:
    iVar13 = (int)piVar35;
    secp256k1_modinv32_update_fg_30_var_cold_1();
  }
  else {
    iVar21 = piVar35[1];
    iVar3 = *piVar35;
    piVar19 = (int *)(long)b->v[0];
    uVar11 = (long)*extraout_RDX * (long)iVar21 + (long)piVar19 * (long)iVar3;
    if ((uVar11 & 0x3fffffff) != 0) goto LAB_00155a26;
    iVar4 = piVar35[3];
    iVar13 = piVar35[2];
    piVar19 = (int *)((long)piVar19 * (long)iVar13);
    piVar35 = (int *)((long)*extraout_RDX * (long)iVar4 + (long)piVar19);
    if (((ulong)piVar35 & 0x3fffffff) == 0) {
      lVar36 = (long)piVar35 >> 0x1e;
      lVar10 = (long)uVar11 >> 0x1e;
      if (iVar6 != 1) {
        uVar11 = 1;
        do {
          lVar10 = (long)extraout_RDX[uVar11] * (long)iVar21 +
                   (long)b->v[uVar11] * (long)iVar3 + lVar10;
          lVar36 = (long)extraout_RDX[uVar11] * (long)iVar4 +
                   (long)b->v[uVar11] * (long)iVar13 + lVar36;
          b->v[uVar11 - 1] = (uint)lVar10 & 0x3fffffff;
          extraout_RDX[uVar11 - 1] = (uint)lVar36 & 0x3fffffff;
          uVar11 = uVar11 + 1;
          lVar36 = lVar36 >> 0x1e;
          lVar10 = lVar10 >> 0x1e;
        } while (((ulong)psVar29 & 0xffffffff) != uVar11);
      }
      b->v[(long)iVar6 + -1] = (int)lVar10;
      extraout_RDX[(long)iVar6 + -1] = (int)lVar36;
      return (int)lVar10;
    }
  }
  secp256k1_modinv32_update_fg_30_var_cold_2();
  lVar10 = 0;
  psVar12 = (secp256k1_modinv32_signed30 *)0x0;
  do {
    if (lVar10 < extraout_EDX) {
      psVar12 = (secp256k1_modinv32_signed30 *)
                ((long)psVar12->v + (long)b->v[lVar10] * (long)iVar13);
    }
    psVar29->v[lVar10] = (uint)psVar12 & 0x3fffffff;
    psVar12 = (secp256k1_modinv32_signed30 *)((long)psVar12 >> 0x1e);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 8);
  if (8 < extraout_EDX) {
    psVar12 = (secp256k1_modinv32_signed30 *)((long)psVar12->v + (long)b->v[8] * (long)iVar13);
  }
  iVar6 = (int)psVar12;
  b_00 = (secp256k1_modinv32_signed30 *)(long)iVar6;
  if (b_00 == psVar12) {
    psVar29->v[8] = iVar6;
    return iVar6;
  }
  secp256k1_modinv32_mul_30_cold_1();
  uVar5 = *extraout_RDX_00;
  psVar42 = (secp256k1_modinv32_signed30 *)(long)(int)uVar5;
  uVar15 = extraout_RDX_00[1];
  lVar10 = (long)(int)uVar15;
  uVar24 = extraout_RDX_00[2];
  psVar12 = (secp256k1_modinv32_signed30 *)(long)(int)uVar24;
  lStack_d8 = (long)(int)extraout_RDX_00[3];
  psVar25 = (secp256k1_fe *)0x9;
  pcStack_e8 = (code *)0x155ac5;
  a_01 = psVar29;
  piStack_c8 = piVar19;
  iVar6 = secp256k1_modinv32_mul_cmp_30(psVar29,9,b_00,-2);
  if (iVar6 < 1) {
    pcStack_e8 = (code *)0x155d2d;
    secp256k1_modinv32_update_de_30_cold_12();
LAB_00155d2d:
    pcStack_e8 = (code *)0x155d32;
    secp256k1_modinv32_update_de_30_cold_11();
LAB_00155d32:
    pcStack_e8 = (code *)0x155d37;
    secp256k1_modinv32_update_de_30_cold_10();
LAB_00155d37:
    pcStack_e8 = (code *)0x155d3c;
    secp256k1_modinv32_update_de_30_cold_9();
LAB_00155d3c:
    pcStack_e8 = (code *)0x155d41;
    secp256k1_modinv32_update_de_30_cold_8();
LAB_00155d41:
    pcStack_e8 = (code *)0x155d46;
    secp256k1_modinv32_update_de_30_cold_7();
LAB_00155d46:
    pcStack_e8 = (code *)0x155d4b;
    secp256k1_modinv32_update_de_30_cold_1();
LAB_00155d4b:
    pcStack_e8 = (code *)0x155d50;
    secp256k1_modinv32_update_de_30_cold_2();
    psVar39 = b_00;
LAB_00155d50:
    pcStack_e8 = (code *)0x155d55;
    secp256k1_modinv32_update_de_30_cold_6();
LAB_00155d55:
    pcStack_e8 = (code *)0x155d5a;
    secp256k1_modinv32_update_de_30_cold_5();
LAB_00155d5a:
    pcStack_e8 = (code *)0x155d5f;
    secp256k1_modinv32_update_de_30_cold_4();
  }
  else {
    psVar25 = (secp256k1_fe *)0x9;
    pcStack_e8 = (code *)0x155ae2;
    a_01 = psVar29;
    iVar6 = secp256k1_modinv32_mul_cmp_30(psVar29,9,b_00,1);
    if (-1 < iVar6) goto LAB_00155d2d;
    psVar25 = (secp256k1_fe *)0x9;
    pcStack_e8 = (code *)0x155aff;
    a_01 = b;
    iVar6 = secp256k1_modinv32_mul_cmp_30(b,9,b_00,-2);
    if (iVar6 < 1) goto LAB_00155d32;
    psVar25 = (secp256k1_fe *)0x9;
    pcStack_e8 = (code *)0x155b1c;
    a_01 = b;
    iVar6 = secp256k1_modinv32_mul_cmp_30(b,9,b_00,1);
    if (-1 < iVar6) goto LAB_00155d37;
    psVar39 = (secp256k1_modinv32_signed30 *)-(long)psVar42;
    if (0 < (long)psVar42) {
      psVar39 = psVar42;
    }
    lVar36 = -lVar10;
    if (lVar10 < 1) {
      lVar36 = lVar10;
    }
    if (lVar36 + 0x40000000 < (long)psVar39) goto LAB_00155d3c;
    psVar39 = (secp256k1_modinv32_signed30 *)-(long)psVar12;
    if (0 < (long)psVar12) {
      psVar39 = psVar12;
    }
    lVar36 = -lStack_d8;
    if (lStack_d8 < 1) {
      lVar36 = lStack_d8;
    }
    if (lVar36 + 0x40000000 < (long)psVar39) goto LAB_00155d41;
    uVar31 = psVar29->v[8] >> 0x1f;
    uVar23 = b->v[8] >> 0x1f;
    psVar25 = (secp256k1_fe *)(ulong)uVar23;
    iVar6 = (uVar23 & uVar15) + (uVar31 & uVar5);
    a_01 = (secp256k1_modinv32_signed30 *)(b->v[0] * lVar10 + (long)psVar29->v[0] * (long)psVar42);
    lVar36 = (long)(int)(iVar6 - ((int)a_01 * b_00[1].v[0] + iVar6 & 0x3fffffffU));
    piVar16 = (int32_t *)((long)a_01->v + lVar36 * b_00->v[0]);
    if (((ulong)piVar16 & 0x3fffffff) != 0) goto LAB_00155d46;
    lStack_d0 = lVar36;
    iVar6 = (uVar23 & (uint)lStack_d8) + (uVar31 & uVar24);
    lVar37 = b->v[0] * lStack_d8 + (long)psVar29->v[0] * (long)psVar12;
    a_01 = (secp256k1_modinv32_signed30 *)0x3fffffff;
    uVar5 = iVar6 - (b_00[1].v[0] * (int)lVar37 + iVar6 & 0x3fffffffU);
    psVar25 = (secp256k1_fe *)(ulong)uVar5;
    uVar11 = (long)b_00->v[0] * (long)(int)uVar5 + lVar37;
    if ((uVar11 & 0x3fffffff) != 0) goto LAB_00155d4b;
    lVar37 = (long)uVar11 >> 0x1e;
    lVar17 = (long)piVar16 >> 0x1e;
    lVar28 = 1;
    do {
      lVar17 = b_00->v[lVar28] * lVar36 + b->v[lVar28] * lVar10 +
               (long)psVar29->v[lVar28] * (long)psVar42 + lVar17;
      psVar39 = (secp256k1_modinv32_signed30 *)(b->v[lVar28] * lStack_d8);
      lVar37 = (long)psVar39->v +
               (long)psVar29->v[lVar28] * (long)psVar12 + lVar37 +
               (long)b_00->v[lVar28] * (long)(int)uVar5;
      psVar29->v[lVar28 + -1] = (uint)lVar17 & 0x3fffffff;
      b->v[lVar28 + -1] = (uint)lVar37 & 0x3fffffff;
      lVar28 = lVar28 + 1;
      lVar37 = lVar37 >> 0x1e;
      lVar17 = lVar17 >> 0x1e;
    } while (lVar28 != 9);
    psVar29->v[8] = (int32_t)lVar17;
    b->v[8] = (int32_t)lVar37;
    psVar25 = (secp256k1_fe *)0x9;
    pcStack_e8 = (code *)0x155cc6;
    a_01 = psVar29;
    iVar6 = secp256k1_modinv32_mul_cmp_30(psVar29,9,b_00,-2);
    psVar12 = b;
    psVar42 = b_00;
    if (iVar6 < 1) goto LAB_00155d50;
    psVar25 = (secp256k1_fe *)0x9;
    pcStack_e8 = (code *)0x155ce3;
    a_01 = psVar29;
    iVar6 = secp256k1_modinv32_mul_cmp_30(psVar29,9,b_00,1);
    if (-1 < iVar6) goto LAB_00155d55;
    psVar25 = (secp256k1_fe *)0x9;
    pcStack_e8 = (code *)0x155cfc;
    a_01 = b;
    iVar6 = secp256k1_modinv32_mul_cmp_30(b,9,b_00,-2);
    if (iVar6 < 1) goto LAB_00155d5a;
    psVar25 = (secp256k1_fe *)0x9;
    pcStack_e8 = (code *)0x155d15;
    a_01 = b;
    iVar6 = secp256k1_modinv32_mul_cmp_30(b,9,b_00,1);
    if (iVar6 < 0) {
      return iVar6;
    }
  }
  pcStack_e8 = secp256k1_modinv32_normalize_30;
  secp256k1_modinv32_update_de_30_cold_3();
  pcStack_e8 = (code *)lVar10;
  psStack_f0 = psVar29;
  psStack_f8 = b;
  psStack_100 = psVar42;
  psStack_108 = psVar39;
  psStack_110 = psVar12;
  uVar5 = a_01->v[0];
  uVar30 = (ulong)uVar5;
  uVar15 = a_01->v[3];
  uVar26 = (ulong)uVar15;
  uVar24 = a_01->v[4];
  uVar22 = (ulong)uVar24;
  uVar23 = a_01->v[5];
  uVar18 = (ulong)uVar23;
  psVar29 = (secp256k1_modinv32_signed30 *)(ulong)(uint)a_01->v[6];
  uVar31 = a_01->v[7];
  uVar11 = (ulong)uVar31;
  iStack_114 = a_01->v[8];
  lVar10 = 0;
  do {
    if (a_01->v[lVar10] < -0x3fffffff) {
      pcStack_150 = (code *)0x1560ad;
      secp256k1_modinv32_normalize_30_cold_7();
LAB_001560ad:
      pcStack_150 = (code *)0x1560b2;
      secp256k1_modinv32_normalize_30_cold_6();
      goto LAB_001560b2;
    }
    if (0x3fffffff < a_01->v[lVar10]) goto LAB_001560ad;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 9);
  uStack_134 = (uint)psVar25;
  psVar25 = (secp256k1_fe *)0x9;
  pcStack_150 = (code *)0x155dea;
  psVar29 = a_01;
  uStack_140 = a_01->v[1];
  uStack_13c = a_01->v[2];
  uStack_138 = a_01->v[6];
  psStack_130 = b_01;
  iVar6 = secp256k1_modinv32_mul_cmp_30(a_01,9,b_01,-2);
  if (iVar6 < 1) {
LAB_001560b2:
    pcStack_150 = (code *)0x1560b7;
    secp256k1_modinv32_normalize_30_cold_5();
LAB_001560b7:
    pcStack_150 = (code *)0x1560bc;
    secp256k1_modinv32_normalize_30_cold_4();
LAB_001560bc:
    pcStack_150 = (code *)0x1560c1;
    secp256k1_modinv32_normalize_30_cold_3();
LAB_001560c1:
    pcStack_150 = (code *)0x1560c6;
    secp256k1_modinv32_normalize_30_cold_2();
  }
  else {
    psVar25 = (secp256k1_fe *)0x9;
    pcStack_150 = (code *)0x155e09;
    psVar29 = a_01;
    iVar6 = secp256k1_modinv32_mul_cmp_30(a_01,9,psStack_130,1);
    if (-1 < iVar6) goto LAB_001560b7;
    uVar7 = iStack_114 >> 0x1f;
    uStack_118 = psStack_130->v[1];
    uVar8 = (uVar7 & uStack_118) + uStack_140;
    uStack_140 = psStack_130->v[2];
    uVar14 = (uVar7 & uStack_140) + uStack_13c;
    uStack_13c = psStack_130->v[3];
    uStack_11c = psStack_130->v[4];
    uStack_120 = psStack_130->v[5];
    uStack_124 = psStack_130->v[6];
    uVar41 = (uVar7 & uStack_124) + uStack_138;
    uStack_138 = psStack_130->v[7];
    uStack_144 = (int)uStack_134 >> 0x1f;
    uStack_134 = psStack_130->v[8];
    uVar34 = ((uVar7 & psStack_130->v[0]) + uVar5 ^ uStack_144) - uStack_144;
    uVar32 = ((int)uVar34 >> 0x1e) + ((uVar8 ^ uStack_144) - uStack_144);
    uVar8 = ((int)uVar32 >> 0x1e) + ((uVar14 ^ uStack_144) - uStack_144);
    uVar43 = ((int)uVar8 >> 0x1e) + (((uVar7 & uStack_13c) + uVar15 ^ uStack_144) - uStack_144);
    uVar15 = ((int)uVar43 >> 0x1e) + (((uVar7 & uStack_11c) + uVar24 ^ uStack_144) - uStack_144);
    uVar5 = ((int)uVar15 >> 0x1e) + (((uVar7 & uStack_120) + uVar23 ^ uStack_144) - uStack_144);
    uVar24 = ((int)uVar5 >> 0x1e) + ((uVar41 ^ uStack_144) - uStack_144);
    uVar23 = ((int)uVar24 >> 0x1e) + (((uVar7 & uStack_138) + uVar31 ^ uStack_144) - uStack_144);
    uVar38 = ((int)uVar23 >> 0x1e) + (((uVar7 & uStack_134) + iStack_114 ^ uStack_144) - uStack_144)
    ;
    uVar18 = (ulong)uVar38;
    uStack_148 = (int)uVar38 >> 0x1f;
    uVar41 = (psStack_130->v[0] & uStack_148) + (uVar34 & 0x3fffffff);
    uVar14 = (uStack_120 & uStack_148) + (uVar5 & 0x3fffffff);
    uVar30 = (ulong)uVar14;
    uVar34 = (uStack_124 & uStack_148) + (uVar24 & 0x3fffffff);
    uVar26 = (ulong)uVar34;
    uVar5 = ((int)uVar41 >> 0x1e) + (uStack_118 & uStack_148) + (uVar32 & 0x3fffffff);
    uVar24 = ((int)uVar5 >> 0x1e) + (uStack_140 & uStack_148) + (uVar8 & 0x3fffffff);
    uVar31 = ((int)uVar24 >> 0x1e) + (uStack_13c & uStack_148) + (uVar43 & 0x3fffffff);
    uVar7 = ((int)uVar31 >> 0x1e) + (uStack_11c & uStack_148) + (uVar15 & 0x3fffffff);
    uVar14 = ((int)uVar7 >> 0x1e) + uVar14;
    uVar34 = ((int)uVar14 >> 0x1e) + uVar34;
    uVar15 = ((int)uVar34 >> 0x1e) + (uStack_138 & uStack_148) + (uVar23 & 0x3fffffff);
    uVar23 = ((int)uVar15 >> 0x1e) + (uStack_134 & uStack_148) + uVar38;
    uVar22 = (ulong)uVar23;
    uVar31 = uVar31 & 0x3fffffff;
    psVar25 = (secp256k1_fe *)(ulong)uVar31;
    uVar7 = uVar7 & 0x3fffffff;
    psVar29 = (secp256k1_modinv32_signed30 *)(ulong)uVar7;
    uVar15 = uVar15 & 0x3fffffff;
    uVar11 = (ulong)uVar15;
    a_01->v[0] = uVar41 & 0x3fffffff;
    a_01->v[1] = uVar5 & 0x3fffffff;
    a_01->v[2] = uVar24 & 0x3fffffff;
    a_01->v[3] = uVar31;
    a_01->v[4] = uVar7;
    a_01->v[5] = uVar14 & 0x3fffffff;
    a_01->v[6] = uVar34 & 0x3fffffff;
    a_01->v[7] = uVar15;
    a_01->v[8] = uVar23;
    if (0x3fffffff < uVar23) goto LAB_001560bc;
    psVar25 = (secp256k1_fe *)0x9;
    pcStack_150 = (code *)0x15607a;
    psVar29 = a_01;
    iVar6 = secp256k1_modinv32_mul_cmp_30(a_01,9,psStack_130,0);
    if (iVar6 < 0) goto LAB_001560c1;
    psVar25 = (secp256k1_fe *)0x9;
    pcStack_150 = (code *)0x156095;
    psVar29 = a_01;
    iVar6 = secp256k1_modinv32_mul_cmp_30(a_01,9,psStack_130,1);
    if (iVar6 < 0) {
      return iVar6;
    }
  }
  pcStack_150 = test_inverse_field;
  secp256k1_modinv32_normalize_30_cold_1();
  r = &sStack_210;
  psVar20 = &sStack_210;
  pcVar40 = secp256k1_fe_inv_var;
  if (extraout_EDX_00 == 0) {
    pcVar40 = secp256k1_fe_inv;
  }
  pcStack_218 = (code *)0x1560fc;
  uStack_178 = uVar11;
  uStack_170 = uVar18;
  uStack_168 = uVar26;
  psStack_160 = a_01;
  uStack_158 = uVar30;
  pcStack_150 = (code *)uVar22;
  (*pcVar40)(&sStack_210);
  if (psVar29 != (secp256k1_modinv32_signed30 *)0x0) {
    *(uint64_t *)(psVar29->v + 8) = sStack_210.n[4];
    *(ulong *)(psVar29[1].v + 1) = CONCAT44(sStack_210.normalized,sStack_210.magnitude);
    *(uint64_t *)(psVar29->v + 4) = sStack_210.n[2];
    *(uint64_t *)(psVar29->v + 6) = sStack_210.n[3];
    *(uint64_t *)psVar29->v = sStack_210.n[0];
    *(uint64_t *)(psVar29->v + 2) = sStack_210.n[1];
  }
  uVar22 = 0xffffffffffff;
  sStack_1b0.n[0] = psVar25->n[0];
  sStack_1b0.n[1] = psVar25->n[1];
  sStack_1b0.n[2] = psVar25->n[2];
  sStack_1b0.n[3] = psVar25->n[3];
  sStack_1b0.n[4] = psVar25->n[4];
  sStack_1b0.magnitude = psVar25->magnitude;
  sStack_1b0.normalized = psVar25->normalized;
  psVar27 = &sStack_1b0;
  pcStack_218 = (code *)0x156165;
  secp256k1_fe_verify(psVar27);
  uVar11 = (sStack_1b0.n[4] >> 0x30) * 0x1000003d1 + sStack_1b0.n[0];
  if (((uVar11 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar11 & 0xfffffffffffff) == 0)) {
    uVar18 = (uVar11 >> 0x34) + sStack_1b0.n[1];
    uVar26 = (uVar18 >> 0x34) + sStack_1b0.n[2];
    uVar30 = (uVar26 >> 0x34) + sStack_1b0.n[3];
    uVar33 = (uVar30 >> 0x34) + (sStack_1b0.n[4] & 0xffffffffffff);
    if ((((uVar18 | uVar11 | uVar26 | uVar30) & 0xfffffffffffff) != 0 || uVar33 != 0) &&
       (((uVar11 | 0x1000003d0) & uVar18 & uVar26 & uVar30 & (uVar33 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_0015620c;
LAB_001565d6:
    pcStack_218 = (code *)0x1565e1;
    secp256k1_fe_verify(&sStack_210);
    uVar22 = sStack_210.n[4] & 0xffffffffffff;
    uVar11 = (sStack_210.n[4] >> 0x30) * 0x1000003d1 + sStack_210.n[0];
    uVar18 = (uVar11 >> 0x34) + sStack_210.n[1];
    uVar26 = (uVar18 >> 0x34) + sStack_210.n[2];
    r = (secp256k1_fe *)((uVar26 >> 0x34) + sStack_210.n[3]);
    uVar30 = ((ulong)r >> 0x34) + uVar22;
    if (((uVar18 | uVar11 | uVar26 | (ulong)r) & 0xfffffffffffff) == 0 && uVar30 == 0) {
LAB_0015665d:
      return (int)uVar11;
    }
    r_00 = (secp256k1_fe *)(uVar30 ^ 0xf000000000000);
    uVar11 = (uVar11 ^ 0x1000003d0) & uVar18 & uVar26 & (ulong)r & (ulong)r_00;
    psVar20 = &sStack_210;
    if (uVar11 == 0xfffffffffffff) goto LAB_0015665d;
  }
  else {
LAB_0015620c:
    pcStack_218 = (code *)0x15621f;
    psVar27 = psVar25;
    secp256k1_fe_mul(&sStack_1b0,psVar25,&sStack_210);
    pcStack_218 = (code *)0x156227;
    secp256k1_fe_verify(&sStack_1b0);
    r_00 = &fe_minus_one;
    pcStack_218 = (code *)0x156233;
    secp256k1_fe_verify(&fe_minus_one);
    if (sStack_1b0.magnitude < 0x20) {
      sStack_1b0.n[0] = sStack_1b0.n[0] + 0xffffefffffc2e;
      sStack_1b0.n[1] = sStack_1b0.n[1] + 0xfffffffffffff;
      sStack_1b0.n[2] = sStack_1b0.n[2] + 0xfffffffffffff;
      sStack_1b0.n[3] = sStack_1b0.n[3] + 0xfffffffffffff;
      sStack_1b0.n[4] = sStack_1b0.n[4] + 0xffffffffffff;
      sStack_1b0.normalized = 0;
      sStack_1b0.magnitude = sStack_1b0.magnitude + 1;
      pcStack_218 = (code *)0x156285;
      secp256k1_fe_verify(&sStack_1b0);
      pcStack_218 = (code *)0x15628d;
      secp256k1_fe_verify(&sStack_1b0);
      uVar11 = (sStack_1b0.n[4] >> 0x30) * 0x1000003d1 + sStack_1b0.n[0];
      uVar18 = (uVar11 >> 0x34) + sStack_1b0.n[1];
      uVar26 = (uVar18 >> 0x34) + sStack_1b0.n[2];
      psVar27 = (secp256k1_fe *)((uVar26 >> 0x34) + sStack_1b0.n[3]);
      uVar30 = ((ulong)psVar27 >> 0x34) + (sStack_1b0.n[4] & 0xffffffffffff);
      if ((((uVar18 | uVar11 | uVar26 | (ulong)psVar27) & 0xfffffffffffff) != 0 || uVar30 != 0) &&
         (r_00 = (secp256k1_fe *)(uVar30 ^ 0xf000000000000),
         ((uVar11 ^ 0x1000003d0) & uVar18 & uVar26 & (ulong)psVar27 & (ulong)r_00) !=
         0xfffffffffffff)) goto LAB_00156674;
      sStack_1e0.n[0] = psVar25->n[0];
      sStack_1e0.n[1] = psVar25->n[1];
      sStack_1e0.n[2] = psVar25->n[2];
      sStack_1e0.n[3] = psVar25->n[3];
      sStack_1e0.n[4] = psVar25->n[4];
      sStack_1e0.magnitude = psVar25->magnitude;
      sStack_1e0.normalized = psVar25->normalized;
      psVar25 = &sStack_1e0;
      pcStack_218 = (code *)0x156333;
      secp256k1_fe_verify(psVar25);
      r_00 = &fe_minus_one;
      pcStack_218 = (code *)0x15633f;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_1e0.magnitude) goto LAB_00156679;
      sStack_1e0.n[0] = sStack_1e0.n[0] + 0xffffefffffc2e;
      sStack_1e0.n[1] = sStack_1e0.n[1] + 0xfffffffffffff;
      sStack_1e0.n[2] = sStack_1e0.n[2] + 0xfffffffffffff;
      sStack_1e0.n[3] = sStack_1e0.n[3] + 0xfffffffffffff;
      sStack_1e0.n[4] = sStack_1e0.n[4] + 0xffffffffffff;
      sStack_1e0.normalized = 0;
      sStack_1e0.magnitude = sStack_1e0.magnitude + 1;
      pcStack_218 = (code *)0x15638a;
      secp256k1_fe_verify(&sStack_1e0);
      pcStack_218 = (code *)0x156392;
      secp256k1_fe_verify(&sStack_1e0);
      uVar11 = (sStack_1e0.n[4] >> 0x30) * 0x1000003d1 + sStack_1e0.n[0];
      if (((uVar11 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar11 & 0xfffffffffffff) == 0)) {
        uVar18 = (uVar11 >> 0x34) + sStack_1e0.n[1];
        uVar26 = (uVar18 >> 0x34) + sStack_1e0.n[2];
        uVar30 = (uVar26 >> 0x34) + sStack_1e0.n[3];
        uVar33 = (uVar30 >> 0x34) + (sStack_1e0.n[4] & 0xffffffffffff);
        if ((((uVar18 | uVar11 | uVar26 | uVar30) & 0xfffffffffffff) == 0 && uVar33 == 0) ||
           (uVar11 = (uVar11 | 0x1000003d0) & uVar18 & uVar26 & uVar30 & (uVar33 ^ 0xf000000000000),
           uVar11 == 0xfffffffffffff)) goto LAB_0015665d;
      }
      psVar27 = &sStack_1e0;
      pcStack_218 = (code *)0x156441;
      (*pcVar40)();
      pcStack_218 = (code *)0x15644c;
      secp256k1_fe_verify(&sStack_210);
      r_00 = &fe_minus_one;
      pcStack_218 = (code *)0x156458;
      secp256k1_fe_verify(&fe_minus_one);
      psVar25 = &sStack_210;
      if (0x1f < sStack_210.magnitude) goto LAB_0015667e;
      sStack_210.n[0] = sStack_210.n[0] + 0xffffefffffc2e;
      sStack_210.n[1] = sStack_210.n[1] + 0xfffffffffffff;
      sStack_210.n[2] = sStack_210.n[2] + 0xfffffffffffff;
      sStack_210.n[3] = sStack_210.n[3] + 0xfffffffffffff;
      sStack_210.n[4] = sStack_210.n[4] + 0xffffffffffff;
      sStack_210.magnitude = sStack_210.magnitude + 1;
      sStack_210.normalized = 0;
      pcStack_218 = (code *)0x1564a1;
      secp256k1_fe_verify(&sStack_210);
      pcStack_218 = (code *)0x1564aa;
      (*pcVar40)(&sStack_210);
      pcStack_218 = (code *)0x1564b2;
      secp256k1_fe_verify(&sStack_210);
      sStack_210.n[0] = sStack_210.n[0] + 1;
      sStack_210.magnitude = sStack_210.magnitude + 1;
      sStack_210.normalized = 0;
      pcStack_218 = (code *)0x1564c4;
      secp256k1_fe_verify(&sStack_210);
      pcStack_218 = (code *)0x1564cc;
      secp256k1_fe_verify(&sStack_210);
      psVar27 = &sStack_1e0;
      pcStack_218 = (code *)0x1564d9;
      r_00 = psVar27;
      secp256k1_fe_verify(psVar27);
      if (sStack_1e0.magnitude + sStack_210.magnitude < 0x21) {
        sStack_210.n[0] = sStack_210.n[0] + sStack_1e0.n[0];
        sStack_210.n[1] = sStack_210.n[1] + sStack_1e0.n[1];
        sStack_210.n[2] = sStack_210.n[2] + sStack_1e0.n[2];
        sStack_210.n[3] = sStack_210.n[3] + sStack_1e0.n[3];
        sStack_210.n[4] = sStack_210.n[4] + sStack_1e0.n[4];
        sStack_210.normalized = 0;
        pcStack_218 = (code *)0x156525;
        sStack_210.magnitude = sStack_1e0.magnitude + sStack_210.magnitude;
        secp256k1_fe_verify(&sStack_210);
        pcStack_218 = (code *)0x15652d;
        secp256k1_fe_verify(&sStack_210);
        uVar11 = (sStack_210.n[4] >> 0x30) * 0x1000003d1 + sStack_210.n[0];
        if (((uVar11 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar11 & 0xfffffffffffff) == 0)) {
          uVar22 = (uVar11 >> 0x34) + sStack_210.n[1];
          uVar18 = (uVar22 >> 0x34) + sStack_210.n[2];
          uVar26 = (uVar18 >> 0x34) + sStack_210.n[3];
          uVar30 = (uVar26 >> 0x34) + (sStack_210.n[4] & 0xffffffffffff);
          if ((((uVar22 | uVar11 | uVar18 | uVar26) & 0xfffffffffffff) == 0 && uVar30 == 0) ||
             (uVar11 = (uVar11 | 0x1000003d0) & uVar22 & uVar18 & uVar26 &
                       (uVar30 ^ 0xf000000000000), uVar11 == 0xfffffffffffff)) goto LAB_0015665d;
        }
        pcStack_218 = (code *)0x1565d6;
        test_inverse_field_cold_2();
        goto LAB_001565d6;
      }
    }
    else {
      pcStack_218 = (code *)0x156674;
      test_inverse_field_cold_7();
LAB_00156674:
      pcStack_218 = (code *)0x156679;
      test_inverse_field_cold_6();
LAB_00156679:
      pcStack_218 = (code *)0x15667e;
      test_inverse_field_cold_5();
LAB_0015667e:
      r = psVar27;
      psVar20 = psVar25;
      psVar27 = &sStack_1b0;
      pcStack_218 = (code *)0x156683;
      test_inverse_field_cold_4();
    }
    pcStack_218 = (code *)0x156688;
    test_inverse_field_cold_3();
  }
  pcStack_218 = test_inverse_scalar;
  test_inverse_field_cold_1();
  pcStack_218 = (code *)0xfffffffffffff;
  psVar25 = (secp256k1_fe *)auStack_288;
  pcVar44 = secp256k1_scalar_inverse_var;
  if (extraout_EDX_01 == 0) {
    pcVar44 = secp256k1_scalar_inverse;
  }
  pcStack_290 = (code *)0x1566b6;
  auStack_248._32_8_ = psVar20;
  auStack_248._40_8_ = psVar27;
  (*pcVar44)(auStack_288);
  if (r_00 != (secp256k1_fe *)0x0) {
    r_00->n[2] = CONCAT44(auStack_288._20_4_,auStack_288._16_4_);
    r_00->n[3] = CONCAT44(auStack_288._28_4_,auStack_288._24_4_);
    r_00->n[0] = CONCAT44(auStack_288._4_4_,auStack_288._0_4_);
    r_00->n[1] = CONCAT44(auStack_288._12_4_,auStack_288._8_4_);
  }
  pcStack_290 = (code *)0x1566d5;
  secp256k1_scalar_verify((secp256k1_scalar *)r);
  auVar46._0_4_ = -(uint)((int)r->n[2] == 0 && (int)r->n[0] == 0);
  auVar46._4_4_ = -(uint)(*(int *)((long)r->n + 0x14) == 0 && *(int *)((long)r->n + 4) == 0);
  auVar46._8_4_ = -(uint)((int)r->n[3] == 0 && (int)r->n[1] == 0);
  auVar46._12_4_ = -(uint)(*(int *)((long)r->n + 0x1c) == 0 && *(int *)((long)r->n + 0xc) == 0);
  iVar6 = movmskps(extraout_EAX,auVar46);
  if (iVar6 != 0xf) {
    r_00 = (secp256k1_fe *)auStack_248;
    pcStack_290 = (code *)0x156709;
    secp256k1_scalar_mul
              ((secp256k1_scalar *)r_00,(secp256k1_scalar *)r,(secp256k1_scalar *)auStack_288);
    pcStack_290 = (code *)0x156711;
    psVar20 = r_00;
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    if (((auStack_248._0_8_ != 1 || auStack_248._8_8_ != 0) || auStack_248._16_8_ != 0) ||
        auStack_248._24_8_ != 0) {
      pcStack_290 = (code *)0x15681b;
      test_inverse_scalar_cold_1();
      goto LAB_0015681b;
    }
    pcStack_290 = (code *)0x156741;
    secp256k1_scalar_add
              ((secp256k1_scalar *)(auStack_288 + 0x20),(secp256k1_scalar *)r,&scalar_minus_one);
    pcStack_290 = (code *)0x156749;
    secp256k1_scalar_verify((secp256k1_scalar *)(auStack_288 + 0x20));
    auVar47._0_4_ = -(uint)(iStack_258 == 0 && auStack_288._32_4_ == 0);
    auVar47._4_4_ = -(uint)(iStack_254 == 0 && iStack_264 == 0);
    auVar47._8_4_ = -(uint)(iStack_250 == 0 && iStack_260 == 0);
    auVar47._12_4_ = -(uint)(iStack_24c == 0 && iStack_25c == 0);
    uVar5 = movmskps(extraout_EAX_00,auVar47);
    if (uVar5 == 0xf) {
      return 0;
    }
    a_00 = (secp256k1_scalar *)(auStack_288 + 0x20);
    pcStack_290 = (code *)0x15677a;
    (*pcVar44)(a_00,a_00);
    pcStack_290 = (code *)0x15678f;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_288,&scalar_minus_one,(secp256k1_scalar *)auStack_288);
    pcStack_290 = (code *)0x156798;
    (*pcVar44)(auStack_288,auStack_288);
    pcStack_290 = (code *)0x1567aa;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_288,(secp256k1_scalar *)auStack_288,&secp256k1_scalar_one
              );
    pcStack_290 = (code *)0x1567b8;
    secp256k1_scalar_add((secp256k1_scalar *)auStack_288,a_00,(secp256k1_scalar *)auStack_288);
    pcStack_290 = (code *)0x1567c0;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_288);
    auVar48._0_4_ = -(uint)(auStack_288._16_4_ == 0 && auStack_288._0_4_ == 0);
    auVar48._4_4_ = -(uint)(auStack_288._20_4_ == 0 && auStack_288._4_4_ == 0);
    auVar48._8_4_ = -(uint)(auStack_288._24_4_ == 0 && auStack_288._8_4_ == 0);
    auVar48._12_4_ = -(uint)(auStack_288._28_4_ == 0 && auStack_288._12_4_ == 0);
    uVar5 = movmskps(extraout_EAX_01,auVar48);
    if (uVar5 == 0xf) {
      return 0;
    }
    pcStack_290 = (code *)0x1567e4;
    test_inverse_scalar_cold_2();
    r_00 = (secp256k1_fe *)auStack_288;
  }
  pcStack_290 = (code *)0x1567ef;
  secp256k1_scalar_verify((secp256k1_scalar *)auStack_288);
  auVar49._0_4_ = -(uint)(auStack_288._16_4_ == 0 && auStack_288._0_4_ == 0);
  auVar49._4_4_ = -(uint)(auStack_288._20_4_ == 0 && auStack_288._4_4_ == 0);
  auVar49._8_4_ = -(uint)(auStack_288._24_4_ == 0 && auStack_288._8_4_ == 0);
  auVar49._12_4_ = -(uint)(auStack_288._28_4_ == 0 && auStack_288._12_4_ == 0);
  uVar5 = movmskps(extraout_EAX_02,auVar49);
  r = (secp256k1_fe *)auStack_288;
  psVar20 = psVar25;
  if (uVar5 == 0xf) {
    return 0;
  }
LAB_0015681b:
  pcStack_290 = test_hsort;
  test_inverse_scalar_cold_3();
  uStack_2a8 = 0x1000003d1;
  __s = auStack_1340;
  psStack_2b8 = r;
  pcStack_2b0 = pcVar40;
  psStack_2a0 = r_00;
  pcStack_298 = pcVar44;
  pcStack_290 = (code *)uVar22;
  memset(__s,0,0x1081);
  uStack_1350 = 0;
  lVar10 = 0x41;
  psStack_1348 = psVar20;
  secp256k1_hsort(__s,0x41,(size_t)psVar20,test_hsort_cmp,&uStack_1350);
  if (0x3f < uStack_1350) {
    test_hsort_is_sorted(auStack_1340,0x41,(size_t)psVar20);
    iVar6 = extraout_EAX_03;
    if (0 < COUNT) {
      iVar21 = 0;
      do {
        uVar9 = testrand_int(0x41);
        count = (size_t)(int)uVar9;
        testrand_bytes_test(auStack_1340,count * (long)psVar20);
        secp256k1_hsort(auStack_1340,count,(size_t)psVar20,test_hsort_cmp,&uStack_1350);
        test_hsort_is_sorted(auStack_1340,count,(size_t)psVar20);
        iVar21 = iVar21 + 1;
        iVar6 = extraout_EAX_04;
      } while (iVar21 < COUNT);
    }
    return iVar6;
  }
  test_hsort_cold_1();
  *extraout_RDX_01 = *extraout_RDX_01 + 1;
  if (extraout_RDX_01[1] != 0) {
    lVar36 = 0;
    uVar11 = extraout_RAX;
    do {
      uVar22 = uVar11 & 0xffffffff;
      bVar1 = __s[lVar36];
      bVar2 = *(byte *)(lVar10 + lVar36);
      uVar11 = (ulong)((uint)bVar1 - (uint)bVar2);
      if (bVar1 == bVar2) {
        uVar11 = uVar22;
      }
      if (bVar1 != bVar2) {
        return (int)uVar11;
      }
      lVar36 = lVar36 + 1;
    } while (extraout_RDX_01[1] != lVar36);
  }
  return 0;
}

Assistant:

static int secp256k1_modinv32_mul_cmp_30(const secp256k1_modinv32_signed30 *a, int alen, const secp256k1_modinv32_signed30 *b, int32_t factor) {
    int i;
    secp256k1_modinv32_signed30 am, bm;
    secp256k1_modinv32_mul_30(&am, a, alen, 1); /* Normalize all but the top limb of a. */
    secp256k1_modinv32_mul_30(&bm, b, 9, factor);
    for (i = 0; i < 8; ++i) {
        /* Verify that all but the top limb of a and b are normalized. */
        VERIFY_CHECK(am.v[i] >> 30 == 0);
        VERIFY_CHECK(bm.v[i] >> 30 == 0);
    }
    for (i = 8; i >= 0; --i) {
        if (am.v[i] < bm.v[i]) return -1;
        if (am.v[i] > bm.v[i]) return 1;
    }
    return 0;
}